

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
cappuccino::
ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::find(ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  time_point now_00;
  undefined8 extraout_RDX;
  optional<unsigned_long> oVar1;
  time_point now;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
  *this_local;
  
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&now,
             &this->m_lock);
  now_00.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  do_prune(this,now_00);
  oVar1 = do_find(this,key);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&now);
  oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  return (optional<unsigned_long>)
         oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto find(const key_type& key) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        const auto      now = std::chrono::steady_clock::now();

        do_prune(now);

        return do_find(key);
    }